

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

void __thiscall S2RegionCoverer::GetInitialCandidates(S2RegionCoverer *this)

{
  bool bVar1;
  int max_level;
  Options *pOVar2;
  int *piVar3;
  reference pSVar4;
  Candidate *candidate;
  S2Cell local_f0;
  uint64 local_b8;
  S2CellId cell_id;
  iterator __end1;
  iterator __begin1;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  vector<S2CellId,_std::allocator<S2CellId>_> cells;
  int local_78 [4];
  undefined1 local_68 [8];
  S2RegionCoverer tmp_coverer;
  S2RegionCoverer *this_local;
  
  tmp_coverer._80_8_ = this;
  S2RegionCoverer((S2RegionCoverer *)local_68);
  pOVar2 = mutable_options((S2RegionCoverer *)local_68);
  local_78[0] = 4;
  cells.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Options::max_cells(&this->options_);
  piVar3 = std::min<int>(local_78,(int *)((long)&cells.
                                                 super__Vector_base<S2CellId,_std::allocator<S2CellId>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4));
  Options::set_max_cells(pOVar2,*piVar3);
  pOVar2 = mutable_options((S2RegionCoverer *)local_68);
  max_level = Options::max_level(&this->options_);
  Options::set_max_level(pOVar2,max_level);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  GetFastCovering((S2RegionCoverer *)local_68,this->region_,
                  (vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  AdjustCellLevels(this,(vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  __end1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin
                     ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  cell_id.id_ = (uint64)std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                                  ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                *)&cell_id);
    if (!bVar1) break;
    pSVar4 = __gnu_cxx::
             __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
             operator*(&__end1);
    local_b8 = pSVar4->id_;
    S2Cell::S2Cell(&local_f0,(S2CellId)local_b8);
    candidate = NewCandidate(this,&local_f0);
    AddCandidate(this,candidate);
    S2Cell::~S2Cell(&local_f0);
    __gnu_cxx::__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)&__range1);
  ~S2RegionCoverer((S2RegionCoverer *)local_68);
  return;
}

Assistant:

void S2RegionCoverer::GetInitialCandidates() {
  // Optimization: start with a small (usually 4 cell) covering of the
  // region's bounding cap.
  S2RegionCoverer tmp_coverer;
  tmp_coverer.mutable_options()->set_max_cells(min(4, options_.max_cells()));
  tmp_coverer.mutable_options()->set_max_level(options_.max_level());
  vector<S2CellId> cells;
  tmp_coverer.GetFastCovering(*region_, &cells);
  AdjustCellLevels(&cells);
  for (S2CellId cell_id : cells) {
    AddCandidate(NewCandidate(S2Cell(cell_id)));
  }
}